

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

char * parse_text(char *data,char delim,uint *len)

{
  uint uVar1;
  char cVar2;
  ushort uVar3;
  ushort *puVar4;
  bool bVar5;
  int iVar6;
  ushort **ppuVar7;
  LY_ERR *pLVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  char local_448 [8];
  char buf [1024];
  char *local_40;
  
  *len = 0;
  uVar12 = 0;
  local_40 = (char *)0x0;
  uVar14 = 0;
  buf[0x3f8] = '\0';
  buf[0x3f9] = '\0';
  buf[0x3fa] = '\0';
  buf[0x3fb] = '\0';
  buf[0x3fc] = '\0';
  buf[0x3fd] = '\0';
  buf[0x3fe] = '\0';
  buf[0x3ff] = '\0';
  bVar5 = false;
LAB_00121500:
  cVar2 = data[uVar12];
  if (bVar5) {
LAB_0012150d:
    if (cVar2 == '\0') {
LAB_00121849:
      pcVar11 = "element content, \"]]>\" found";
      goto LAB_00121850;
    }
  }
  else {
    pcVar11 = data + uVar12;
    if (cVar2 != delim) {
      if (cVar2 != ']') goto LAB_0012150d;
      if ((pcVar11[1] != ']') || (pcVar11[2] != '>')) goto LAB_0012155a;
      goto LAB_00121849;
    }
    if ((delim != '<') || (iVar6 = strncmp(pcVar11,"<![CDATA[",9), iVar6 != 0)) {
      uVar12 = (uint)buf._1016_8_;
      if (uVar14 == 0) {
        if (local_40 == (char *)0x0) {
          pcVar11 = strdup("");
          return pcVar11;
        }
LAB_001218e5:
        local_40[(int)uVar12] = '\0';
        return local_40;
      }
      if (local_40 == (char *)0x0) {
        local_40 = (char *)malloc((long)(int)(uVar14 + 1));
        uVar12 = uVar14;
      }
      else {
        local_40 = (char *)realloc(local_40,(long)(int)(uVar12 + uVar14 + 1));
        uVar12 = uVar12 + uVar14;
      }
      if (local_40 != (char *)0x0) {
        memcpy(local_40 + (int)(uVar12 - uVar14),local_448,(long)(int)uVar14);
        goto LAB_001218e5;
      }
      goto LAB_001218f1;
    }
  }
LAB_0012155a:
  if (0x3fc < (int)uVar14) {
    if (local_40 == (char *)0x0) {
      local_40 = (char *)malloc((ulong)(uVar14 + 1));
      uVar12 = uVar14;
    }
    else {
      iVar6 = (int)buf._1016_8_;
      local_40 = (char *)ly_realloc(local_40,(ulong)(iVar6 + uVar14 + 1));
      uVar12 = iVar6 + uVar14;
    }
    if (local_40 == (char *)0x0) {
LAB_001218f1:
      pLVar8 = ly_errno_location();
      *pLVar8 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","parse_text");
      return (char *)0x0;
    }
    buf._1016_8_ = (ulong)uVar12;
    memcpy(local_40 + (int)(uVar12 - uVar14),local_448,(ulong)uVar14);
    uVar12 = *len;
    uVar14 = 0;
  }
  if (bVar5) {
LAB_001215ce:
    if (((data[uVar12] == ']') && (data[(ulong)uVar12 + 1] == ']')) &&
       (data[(ulong)uVar12 + 2] == '>')) {
      uVar12 = uVar12 + 3;
      *len = uVar12;
      uVar14 = uVar14 - 1;
      bVar5 = false;
    }
    else {
      local_448[(int)uVar14] = data[uVar12];
      uVar12 = uVar12 + 1;
      *len = uVar12;
      bVar5 = true;
    }
    goto LAB_00121841;
  }
  pcVar11 = data + uVar12;
  iVar6 = strncmp(pcVar11,"<![CDATA[",9);
  if (iVar6 == 0) {
    uVar12 = uVar12 + 9;
    *len = uVar12;
    goto LAB_001215ce;
  }
  if (*pcVar11 == '&') {
    uVar1 = uVar12 + 1;
    *len = uVar1;
    cVar2 = data[uVar1];
    if (cVar2 == '#') {
      uVar1 = uVar12 + 2;
      *len = uVar1;
      ppuVar7 = __ctype_b_loc();
      puVar4 = *ppuVar7;
      lVar9 = (long)data[uVar1];
      if ((*(byte *)((long)puVar4 + lVar9 * 2 + 1) & 8) == 0) {
        *len = uVar12 + 3;
        if (data[uVar1] == 'x') {
          lVar9 = (long)data[uVar12 + 3];
          uVar3 = puVar4[lVar9];
          if ((uVar3 >> 0xc & 1) != 0) {
            uVar12 = uVar12 + 4;
            iVar6 = 0;
            do {
              iVar13 = (uint)((char)lVar9 < 'G') * 0x20 + -0x57;
              if ((uVar3 >> 0xb & 1) != 0) {
                iVar13 = -0x30;
              }
              iVar6 = iVar6 * 0x10 + (int)(char)lVar9 + iVar13;
              *len = uVar12;
              lVar9 = (long)data[uVar12];
              uVar3 = puVar4[lVar9];
              uVar12 = uVar12 + 1;
            } while ((uVar3 >> 0xc & 1) != 0);
            goto LAB_00121812;
          }
        }
        pcVar11 = "character reference";
        goto LAB_00121850;
      }
      uVar12 = uVar12 + 3;
      iVar6 = 0;
      do {
        iVar6 = (int)(char)lVar9 + iVar6 * 10 + -0x30;
        *len = uVar12;
        uVar10 = (ulong)uVar12;
        lVar9 = (long)data[uVar10];
        uVar12 = uVar12 + 1;
      } while ((*(byte *)((long)puVar4 + lVar9 * 2 + 1) & 8) != 0);
      if (data[uVar10] != ';') {
        pcVar11 = "character reference, missing semicolon";
        goto LAB_00121850;
      }
LAB_00121812:
      uVar12 = pututf8(local_448 + (int)uVar14,iVar6);
      if (uVar12 == 0) {
        pcVar11 = "character reference value";
LAB_00121850:
        ly_vlog(LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,pcVar11);
LAB_00121860:
        free(local_40);
        return (char *)0x0;
      }
      uVar14 = (uVar14 + uVar12) - 1;
      uVar12 = *len + 1;
    }
    else {
      pcVar11 = data + uVar1;
      if (cVar2 == 'g') {
        if ((pcVar11[1] != 't') || (pcVar11[2] != ';')) goto LAB_001216d3;
        local_448[(int)uVar14] = '>';
      }
      else {
        if (((cVar2 != 'l') || (pcVar11[1] != 't')) || (pcVar11[2] != ';')) {
LAB_001216d3:
          iVar6 = strncmp(pcVar11,"amp;",4);
          if (iVar6 == 0) {
            local_448[(int)uVar14] = '&';
            uVar12 = uVar12 + 5;
            goto LAB_00121838;
          }
          iVar6 = strncmp(pcVar11,"apos;",5);
          if (iVar6 == 0) {
            local_448[(int)uVar14] = '\'';
          }
          else {
            iVar6 = strncmp(pcVar11,"quot;",5);
            if (iVar6 != 0) {
              pcVar11 = "entity reference (only predefined references are supported)";
              goto LAB_00121850;
            }
            local_448[(int)uVar14] = '\"';
          }
          uVar12 = uVar12 + 6;
          goto LAB_00121838;
        }
        local_448[(int)uVar14] = '<';
      }
      uVar12 = uVar12 + 4;
    }
  }
  else {
    uVar12 = copyutf8(local_448 + (int)uVar14,pcVar11);
    if (uVar12 == 0) goto LAB_00121860;
    uVar14 = (uVar14 + uVar12) - 1;
    uVar12 = *len + uVar12;
  }
LAB_00121838:
  *len = uVar12;
  bVar5 = false;
LAB_00121841:
  uVar14 = uVar14 + 1;
  goto LAB_00121500;
}

Assistant:

static char *
parse_text(const char *data, char delim, unsigned int *len)
{
#define BUFSIZE 1024

    char buf[BUFSIZE];
    char *result = NULL, *aux;
    unsigned int r;
    int o, size = 0;
    int cdsect = 0;
    int32_t n;

    for (*len = o = 0; cdsect || data[*len] != delim; o++) {
        if (!data[*len] || (!cdsect && !strncmp(&data[*len], "]]>", 3))) {
            LOGVAL(LYE_XML_INVAL, LY_VLOG_NONE, NULL, "element content, \"]]>\" found");
            goto error;
        }

loop:

        if (o > BUFSIZE - 4) {
            /* add buffer into the result */
            if (result) {
                size = size + o;
                aux = ly_realloc(result, size + 1);
                result = aux;
            } else {
                size = o;
                result = malloc((size + 1) * sizeof *result);
            }
            if (!result) {
                LOGMEM;
                return NULL;
            }
            memcpy(&result[size - o], buf, o);

            /* write again into the beginning of the buffer */
            o = 0;
        }

        if (cdsect || !strncmp(&data[*len], "<![CDATA[", 9)) {
            /* CDSect */
            if (!cdsect) {
                cdsect = 1;
                *len += 9;
            }
            if (data[*len] && !strncmp(&data[*len], "]]>", 3)) {
                *len += 3;
                cdsect = 0;
                o--;            /* we don't write any data in this iteration */
            } else {
                buf[o] = data[*len];
                (*len)++;
            }
        } else if (data[*len] == '&') {
            (*len)++;
            if (data[*len] != '#') {
                /* entity reference - only predefined refs are supported */
                if (!strncmp(&data[*len], "lt;", 3)) {
                    buf[o] = '<';
                    *len += 3;
                } else if (!strncmp(&data[*len], "gt;", 3)) {
                    buf[o] = '>';
                    *len += 3;
                } else if (!strncmp(&data[*len], "amp;", 4)) {
                    buf[o] = '&';
                    *len += 4;
                } else if (!strncmp(&data[*len], "apos;", 5)) {
                    buf[o] = '\'';
                    *len += 5;
                } else if (!strncmp(&data[*len], "quot;", 5)) {
                    buf[o] = '\"';
                    *len += 5;
                } else {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_NONE, NULL, "entity reference (only predefined references are supported)");
                    goto error;
                }
            } else {
                /* character reference */
                (*len)++;
                if (isdigit(data[*len])) {
                    for (n = 0; isdigit(data[*len]); (*len)++) {
                        n = (10 * n) + (data[*len] - '0');
                    }
                    if (data[*len] != ';') {
                        LOGVAL(LYE_XML_INVAL, LY_VLOG_NONE, NULL, "character reference, missing semicolon");
                        goto error;
                    }
                } else if (data[(*len)++] == 'x' && isxdigit(data[*len])) {
                    for (n = 0; isxdigit(data[*len]); (*len)++) {
                        if (isdigit(data[*len])) {
                            r = (data[*len] - '0');
                        } else if (data[*len] > 'F') {
                            r = 10 + (data[*len] - 'a');
                        } else {
                            r = 10 + (data[*len] - 'A');
                        }
                        n = (16 * n) + r;
                    }
                } else {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_NONE, NULL, "character reference");
                    goto error;

                }
                r = pututf8(&buf[o], n);
                if (!r) {
                    LOGVAL(LYE_XML_INVAL, LY_VLOG_NONE, NULL, "character reference value");
                    goto error;
                }
                o += r - 1;     /* o is ++ in for loop */
                (*len)++;
            }
        } else {
            r = copyutf8(&buf[o], &data[*len]);
            if (!r) {
                goto error;
            }

            o += r - 1;     /* o is ++ in for loop */
            (*len) = (*len) + r;
        }
    }

    if (delim == '<' && !strncmp(&data[*len], "<![CDATA[", 9)) {
        /* ignore loop's end condition on beginning of CDSect */
        goto loop;
    }
#undef BUFSIZE

    if (o) {
        if (result) {
            size = size + o;
            aux = realloc(result, size + 1);
            result = aux;
        } else {
            size = o;
            result = malloc((size + 1) * sizeof *result);
        }
        if (!result) {
            LOGMEM;
            return NULL;
        }
        memcpy(&result[size - o], buf, o);
    }
    if (result) {
        result[size] = '\0';
    } else {
        size = 0;
        result = strdup("");
    }

    return result;

error:
    free(result);
    return NULL;
}